

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  int iVar1;
  short sVar2;
  Column *pCol_00;
  Parse *pParse_00;
  Index *pIdx;
  int savedSelfTab;
  Parse *pParse;
  int x;
  int op;
  Column *pCol;
  int regOut_local;
  int iCol_local;
  int iTabCur_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  if ((iCol < 0) || (iCol == pTab->iPKey)) {
    sqlite3VdbeAddOp2(v,0x87,iTabCur,regOut);
  }
  else {
    if (pTab->eTabType == '\x01') {
      pParse._4_4_ = 0xaf;
      pParse._0_4_ = iCol;
    }
    else {
      pCol_00 = pTab->aCol + iCol;
      if ((pCol_00->colFlags & 0x20) != 0) {
        pParse_00 = sqlite3VdbeParser(v);
        if ((pCol_00->colFlags & 0x100) != 0) {
          sqlite3ErrorMsg(pParse_00,"generated column loop on \"%s\"",pCol_00->zCnName);
          return;
        }
        iVar1 = pParse_00->iSelfTab;
        pCol_00->colFlags = pCol_00->colFlags | 0x100;
        pParse_00->iSelfTab = iTabCur + 1;
        sqlite3ExprCodeGeneratedColumn(pParse_00,pTab,pCol_00,regOut);
        pParse_00->iSelfTab = iVar1;
        pCol_00->colFlags = pCol_00->colFlags & 0xfeff;
        return;
      }
      if ((pTab->tabFlags & 0x80) == 0) {
        sVar2 = sqlite3TableColumnToStorage(pTab,(i16)iCol);
      }
      else {
        pIdx = sqlite3PrimaryKeyIndex(pTab);
        sVar2 = sqlite3TableColumnToIndex(pIdx,(i16)iCol);
      }
      pParse._0_4_ = (int)sVar2;
      pParse._4_4_ = 0x5e;
    }
    sqlite3VdbeAddOp3(v,pParse._4_4_,iTabCur,(int)pParse,regOut);
    sqlite3ColumnDefault(v,pTab,iCol,regOut);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* Parsing context */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  Column *pCol;
  assert( v!=0 );
  assert( pTab!=0 );
  assert( iCol!=XN_EXPR );
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
    VdbeComment((v, "%s.rowid", pTab->zName));
  }else{
    int op;
    int x;
    if( IsVirtual(pTab) ){
      op = OP_VColumn;
      x = iCol;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( (pCol = &pTab->aCol[iCol])->colFlags & COLFLAG_VIRTUAL ){
      Parse *pParse = sqlite3VdbeParser(v);
      if( pCol->colFlags & COLFLAG_BUSY ){
        sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"",
                        pCol->zCnName);
      }else{
        int savedSelfTab = pParse->iSelfTab;
        pCol->colFlags |= COLFLAG_BUSY;
        pParse->iSelfTab = iTabCur+1;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, regOut);
        pParse->iSelfTab = savedSelfTab;
        pCol->colFlags &= ~COLFLAG_BUSY;
      }
      return;
#endif
    }else if( !HasRowid(pTab) ){
      testcase( iCol!=sqlite3TableColumnToStorage(pTab, iCol) );
      x = sqlite3TableColumnToIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
      op = OP_Column;
    }else{
      x = sqlite3TableColumnToStorage(pTab,iCol);
      testcase( x!=iCol );
      op = OP_Column;
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}